

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::avx::BVHNBuilderQuantizedVirtual<8>::
BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::QuadMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::QuadMv<4>_>_> *this,
          PrimRef *prims,range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  FastAllocator *this_00;
  ThreadLocal *pTVar10;
  ThreadLocal2 *pTVar11;
  iterator __position;
  Ref<embree::Geometry> *pRVar12;
  Geometry *pGVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  undefined1 (*pauVar19) [16];
  size_t sVar20;
  long lVar21;
  unsigned_long uVar22;
  ulong uVar23;
  long lVar24;
  float *pfVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 in_ZMM0 [64];
  vuint<4> vprimID;
  vuint<4> vgeomID;
  ThreadLocal2 *local_128;
  char cStack_120;
  undefined7 uStack_11f;
  undefined1 auStack_118 [16];
  undefined1 auStack_108 [16];
  ThreadLocal2 *local_f8;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [16];
  undefined1 auStack_d8 [16];
  ThreadLocal2 *local_c8;
  char cStack_c0;
  undefined7 uStack_bf;
  undefined1 auStack_b8 [16];
  undefined1 auStack_a8 [16];
  long local_98;
  BVHNBuilderT<embree::avx::CreateLeafQuantized<8,_embree::QuadMv<4>_>_> *local_90;
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined1 auStack_78 [16];
  undefined1 auStack_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar28 = in_ZMM0._0_16_;
  uVar22 = set->_begin;
  uVar16 = (set->_end - uVar22) + 3;
  uVar17 = uVar16 >> 2;
  local_f8 = (ThreadLocal2 *)(uVar17 * 0xe0);
  this_00 = alloc->alloc;
  pTVar10 = alloc->talloc1;
  pTVar11 = pTVar10->parent;
  if (this_00 != (pTVar11->alloc)._M_b._M_p) {
    cStack_c0 = '\x01';
    local_c8 = pTVar11;
    MutexSys::lock(&pTVar11->mutex);
    if ((pTVar11->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar11->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesUsed + (pTVar11->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar11->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar11->alloc0).end + (pTVar11->alloc1).end) -
           ((pTVar11->alloc0).cur + (pTVar11->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar11->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar11->alloc1).bytesWasted + (pTVar11->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar11->alloc0).end = 0;
    (pTVar11->alloc0).allocBlockSize = 0;
    (pTVar11->alloc0).bytesUsed = 0;
    (pTVar11->alloc0).bytesWasted = 0;
    (pTVar11->alloc0).ptr = (char *)0x0;
    (pTVar11->alloc0).cur = 0;
    (pTVar11->alloc0).end = 0;
    (pTVar11->alloc0).allocBlockSize = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
      (pTVar11->alloc1).bytesUsed = 0;
      (pTVar11->alloc1).bytesWasted = 0;
      (pTVar11->alloc1).ptr = (char *)0x0;
      (pTVar11->alloc1).cur = 0;
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
    }
    else {
      (pTVar11->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (pTVar11->alloc1).ptr = (char *)0x0;
      (pTVar11->alloc1).cur = 0;
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
      (pTVar11->alloc1).end = 0;
      (pTVar11->alloc1).allocBlockSize = 0;
      (pTVar11->alloc1).bytesUsed = 0;
      (pTVar11->alloc1).bytesWasted = 0;
      (pTVar11->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (pTVar11->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_128 = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
    cStack_120 = '\x01';
    auVar28 = (undefined1  [16])0x0;
    local_88 = pTVar11;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_88);
    }
    else {
      *__position._M_current = local_88;
      pppTVar2 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (cStack_120 == '\x01') {
      MutexSys::unlock(&local_128->mutex);
    }
    if (cStack_c0 == '\x01') {
      MutexSys::unlock(&local_c8->mutex);
    }
  }
  pTVar10->bytesUsed = (long)&(local_f8->mutex).mutex + pTVar10->bytesUsed;
  sVar20 = pTVar10->cur;
  uVar23 = (ulong)(-(int)sVar20 & 0xf);
  uVar26 = (long)&(local_f8->mutex).mutex + uVar23 + sVar20;
  pTVar10->cur = uVar26;
  if (pTVar10->end < uVar26) {
    pTVar10->cur = sVar20;
    if ((ThreadLocal2 *)pTVar10->allocBlockSize < (ThreadLocal2 *)((long)local_f8 << 2)) {
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_f8);
    }
    else {
      local_128 = (ThreadLocal2 *)pTVar10->allocBlockSize;
      pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
      pTVar10->ptr = pcVar18;
      sVar20 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
      pTVar10->bytesWasted = sVar20;
      pTVar10->cur = 0;
      pTVar10->end = (size_t)local_128;
      pTVar10->cur = (size_t)local_f8;
      if (local_128 < local_f8) {
        pTVar10->cur = 0;
        local_128 = (ThreadLocal2 *)pTVar10->allocBlockSize;
        pcVar18 = (char *)FastAllocator::malloc(this_00,(size_t)&local_128);
        pTVar10->ptr = pcVar18;
        sVar20 = (pTVar10->end - pTVar10->cur) + pTVar10->bytesWasted;
        pTVar10->bytesWasted = sVar20;
        pTVar10->cur = 0;
        pTVar10->end = (size_t)local_128;
        pTVar10->cur = (size_t)local_f8;
        if (local_128 < local_f8) {
          pTVar10->cur = 0;
          pcVar18 = (char *)0x0;
        }
        else {
          pTVar10->bytesWasted = sVar20;
        }
      }
      else {
        pTVar10->bytesWasted = sVar20;
      }
    }
  }
  else {
    pTVar10->bytesWasted = pTVar10->bytesWasted + uVar23;
    pcVar18 = pTVar10->ptr + (uVar26 - (long)local_f8);
  }
  if (3 < uVar16) {
    lVar24 = uVar17 + (uVar17 == 0);
    lVar21 = 0;
    auVar28 = vpcmpeqd_avx(auVar28,auVar28);
    local_128 = (ThreadLocal2 *)0x0;
    pTVar11 = local_128;
    local_98 = lVar24;
    local_90 = this;
    do {
      uVar16 = set->_end;
      auStack_108 = (undefined1  [16])0x0;
      cStack_120 = 0;
      uStack_11f = 0;
      auStack_118 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      auStack_b8 = (undefined1  [16])0x0;
      auStack_68 = (undefined1  [16])0x0;
      uStack_80 = 0;
      auStack_78 = (undefined1  [16])0x0;
      auStack_d8 = (undefined1  [16])0x0;
      auStack_e8 = (undefined1  [16])0x0;
      local_128 = pTVar11;
      local_f8 = pTVar11;
      uStack_f0 = uStack_80;
      local_c8 = pTVar11;
      cStack_c0 = cStack_120;
      uStack_bf = uStack_11f;
      local_88 = pTVar11;
      local_58 = auVar28;
      local_48 = auVar28;
      if (uVar22 < uVar16) {
        pRVar12 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        pfVar25 = prims[uVar22].upper.field_0.m128 + 3;
        uVar26 = 0;
        do {
          fVar7 = pfVar25[-4];
          fVar8 = *pfVar25;
          pGVar13 = pRVar12[(uint)fVar7].ptr;
          lVar27 = (ulong)(uint)fVar8 *
                   pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar24 = *(long *)&pGVar13->field_0x58;
          lVar14 = *(long *)&pGVar13[1].time_range.upper;
          p_Var15 = pGVar13[1].intersectionFilterN;
          auVar3 = *(undefined1 (*) [16])
                    (lVar14 + (ulong)*(uint *)(lVar24 + lVar27) * (long)p_Var15);
          auVar4 = *(undefined1 (*) [16])
                    (lVar14 + (ulong)*(uint *)(lVar24 + 4 + lVar27) * (long)p_Var15);
          auVar5 = *(undefined1 (*) [16])
                    (lVar14 + (ulong)*(uint *)(lVar24 + 8 + lVar27) * (long)p_Var15);
          auVar6 = *(undefined1 (*) [16])
                    (lVar14 + (ulong)*(uint *)(lVar24 + 0xc + lVar27) * (long)p_Var15);
          *(int *)((long)&local_128 + uVar26 * 4) = auVar3._0_4_;
          uVar9 = vextractps_avx(auVar3,1);
          *(undefined4 *)(auStack_118 + uVar26 * 4) = uVar9;
          uVar9 = vextractps_avx(auVar3,2);
          *(undefined4 *)(auStack_108 + uVar26 * 4) = uVar9;
          *(int *)((long)&local_c8 + uVar26 * 4) = auVar4._0_4_;
          uVar9 = vextractps_avx(auVar4,1);
          *(undefined4 *)(auStack_b8 + uVar26 * 4) = uVar9;
          uVar9 = vextractps_avx(auVar4,2);
          *(undefined4 *)(auStack_a8 + uVar26 * 4) = uVar9;
          *(int *)((long)&local_88 + uVar26 * 4) = auVar5._0_4_;
          uVar9 = vextractps_avx(auVar5,1);
          *(undefined4 *)(auStack_78 + uVar26 * 4) = uVar9;
          uVar9 = vextractps_avx(auVar5,2);
          *(undefined4 *)(auStack_68 + uVar26 * 4) = uVar9;
          *(int *)((long)&local_f8 + uVar26 * 4) = auVar6._0_4_;
          uVar9 = vextractps_avx(auVar6,1);
          *(undefined4 *)(auStack_e8 + uVar26 * 4) = uVar9;
          uVar9 = vextractps_avx(auVar6,2);
          *(undefined4 *)(auStack_d8 + uVar26 * 4) = uVar9;
          *(float *)(local_48 + uVar26 * 4) = fVar7;
          *(float *)(local_58 + uVar26 * 4) = fVar8;
          uVar23 = uVar26 + 1;
          if (2 < uVar26) break;
          lVar24 = uVar26 + uVar22;
          pfVar25 = pfVar25 + 8;
          uVar26 = uVar23;
        } while (lVar24 + 1U < uVar16);
        uVar22 = uVar22 + uVar23;
        lVar24 = local_98;
        this = local_90;
      }
      pauVar19 = (undefined1 (*) [16])(pcVar18 + lVar21 * 0xe0);
      auVar3[8] = cStack_120;
      auVar3._0_8_ = local_128;
      auVar3._9_7_ = uStack_11f;
      auVar5[8] = cStack_c0;
      auVar5._0_8_ = local_c8;
      auVar5._9_7_ = uStack_bf;
      auVar6._8_8_ = uStack_80;
      auVar6._0_8_ = local_88;
      auVar4._8_8_ = uStack_f0;
      auVar4._0_8_ = local_f8;
      auVar3 = vmovntps_avx(auVar3);
      *pauVar19 = auVar3;
      auVar3 = vmovntps_avx(auStack_118);
      pauVar19[1] = auVar3;
      auVar3 = vmovntps_avx(auStack_108);
      pauVar19[2] = auVar3;
      auVar3 = vmovntps_avx(auVar5);
      pauVar19[3] = auVar3;
      auVar3 = vmovntps_avx(auStack_b8);
      pauVar19[4] = auVar3;
      auVar3 = vmovntps_avx(auStack_a8);
      pauVar19[5] = auVar3;
      auVar3 = vmovntps_avx(auVar6);
      pauVar19[6] = auVar3;
      auVar3 = vmovntps_avx(auStack_78);
      pauVar19[7] = auVar3;
      auVar3 = vmovntps_avx(auStack_68);
      pauVar19[8] = auVar3;
      auVar3 = vmovntps_avx(auVar4);
      pauVar19[9] = auVar3;
      auVar3 = vmovntps_avx(auStack_e8);
      pauVar19[10] = auVar3;
      auVar3 = vmovntps_avx(auStack_d8);
      pauVar19[0xb] = auVar3;
      auVar3 = vmovntps_avx(local_48);
      pauVar19[0xc] = auVar3;
      auVar3 = vmovntps_avx(local_58);
      pauVar19[0xd] = auVar3;
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar24);
  }
  uVar16 = 7;
  if (uVar17 < 7) {
    uVar16 = uVar17;
  }
  return (NodeRef)(uVar16 | (ulong)pcVar18 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }